

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void emitblock(aec_stream *strm,int k,int ref)

{
  uint uVar1;
  internal_state *piVar2;
  uint32_t *puVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  uint local_4c;
  ulong uStack_48;
  int p;
  uint64_t a;
  uint8_t *o;
  uint64_t mask;
  uint32_t *in_end;
  uint32_t *in;
  internal_state *state;
  int ref_local;
  int k_local;
  aec_stream *strm_local;
  
  piVar2 = strm->state;
  in_end = piVar2->block + ref;
  puVar3 = piVar2->block;
  uVar1 = strm->block_size;
  uStack_48 = (ulong)*piVar2->cds;
  local_4c = piVar2->bits;
  a = (uint64_t)piVar2->cds;
  while (in_end < puVar3 + uVar1) {
    uStack_48 = uStack_48 << 0x38;
    local_4c = (int)local_4c % 8 + 0x38;
    for (; k < (int)local_4c && in_end < puVar3 + uVar1; in_end = in_end + 1) {
      local_4c = local_4c - k;
      uStack_48 = (((ulong)*in_end & (1L << ((byte)k & 0x3f)) - 1U) << ((byte)local_4c & 0x3f)) +
                  uStack_48;
    }
    uVar9 = (undefined1)(uStack_48 >> 0x10);
    uVar8 = (undefined1)(uStack_48 >> 0x18);
    uVar7 = (undefined1)(uStack_48 >> 0x20);
    uVar6 = (undefined1)(uStack_48 >> 0x28);
    uVar5 = (undefined1)(uStack_48 >> 0x30);
    uVar4 = (undefined1)(uStack_48 >> 0x38);
    switch(local_4c & 0xfffffff8) {
    case 0:
      *(undefined1 *)a = uVar4;
      *(undefined1 *)(a + 1) = uVar5;
      *(undefined1 *)(a + 2) = uVar6;
      *(undefined1 *)(a + 3) = uVar7;
      *(undefined1 *)(a + 4) = uVar8;
      *(undefined1 *)(a + 5) = uVar9;
      *(char *)(a + 6) = (char)(uStack_48 >> 8);
      a = a + 7;
      break;
    case 8:
      *(undefined1 *)a = uVar4;
      *(undefined1 *)(a + 1) = uVar5;
      *(undefined1 *)(a + 2) = uVar6;
      *(undefined1 *)(a + 3) = uVar7;
      *(undefined1 *)(a + 4) = uVar8;
      *(undefined1 *)(a + 5) = uVar9;
      uStack_48 = uStack_48 >> 8;
      a = a + 6;
      break;
    case 0x10:
      *(undefined1 *)a = uVar4;
      *(undefined1 *)(a + 1) = uVar5;
      *(undefined1 *)(a + 2) = uVar6;
      *(undefined1 *)(a + 3) = uVar7;
      *(undefined1 *)(a + 4) = uVar8;
      uStack_48 = uStack_48 >> 0x10;
      a = a + 5;
      break;
    case 0x18:
      *(undefined1 *)a = uVar4;
      *(undefined1 *)(a + 1) = uVar5;
      *(undefined1 *)(a + 2) = uVar6;
      *(undefined1 *)(a + 3) = uVar7;
      uStack_48 = uStack_48 >> 0x18;
      a = a + 4;
      break;
    case 0x20:
      *(undefined1 *)a = uVar4;
      *(undefined1 *)(a + 1) = uVar5;
      *(undefined1 *)(a + 2) = uVar6;
      uStack_48 = uStack_48 >> 0x20;
      a = a + 3;
      break;
    case 0x28:
      *(undefined1 *)a = uVar4;
      *(undefined1 *)(a + 1) = uVar5;
      uStack_48 = uStack_48 >> 0x28;
      a = a + 2;
      break;
    case 0x30:
      *(undefined1 *)a = uVar4;
      uStack_48 = uStack_48 >> 0x30;
      a = a + 1;
      break;
    default:
      uStack_48 = uStack_48 >> 0x38;
    }
  }
  *(char *)a = (char)uStack_48;
  piVar2->cds = (uint8_t *)a;
  piVar2->bits = (int)local_4c % 8;
  return;
}

Assistant:

static inline void emitblock(struct aec_stream *strm, int k, int ref)
{
    /**
       Emit the k LSB of a whole block of input data.
    */

    struct internal_state *state = strm->state;
    uint32_t *in = state->block + ref;
    uint32_t *in_end = state->block + strm->block_size;
    uint64_t mask = (UINT64_C(1) << k) - 1;
    uint8_t *o = state->cds;
    uint64_t a = *o;
    int p = state->bits;

    while(in < in_end) {
        a <<= 56;
        p = (p % 8) + 56;

        while (p > k && in < in_end) {
            p -= k;
            a += ((uint64_t)(*in++) & mask) << p;
        }

        switch (p & ~7) {
        case 0:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            o[6] = (uint8_t)(a >> 8);
            o += 7;
            break;
        case 8:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            a >>= 8;
            o += 6;
            break;
        case 16:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            a >>= 16;
            o += 5;
            break;
        case 24:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            a >>= 24;
            o += 4;
            break;
        case 32:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            a >>= 32;
            o += 3;
            break;
        case 40:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            a >>= 40;
            o += 2;
            break;
        case 48:
            *o++ = (uint8_t)(a >> 56);
            a >>= 48;
            break;
        default:
            a >>= 56;
            break;
        }
    }

    *o = (uint8_t)a;
    state->cds = o;
    state->bits = p % 8;
}